

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O0

void __thiscall dynet::NamedTimer::show(NamedTimer *this)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *item;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_ffffffffffffffc8;
  _Setw in_stack_ffffffffffffffd0;
  _Setprecision in_stack_ffffffffffffffd4;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                          *)CONCAT44(in_stack_ffffffffffffffd4._M_n,in_stack_ffffffffffffffd0._M_n))
    ;
    in_stack_ffffffffffffffd4 = std::setprecision(4);
    poVar3 = std::operator<<((ostream *)&std::cout,in_stack_ffffffffffffffd4);
    in_stack_ffffffffffffffd0 = std::setw(0xb);
    poVar3 = std::operator<<(poVar3,in_stack_ffffffffffffffd0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar2->second);
    poVar3 = std::operator<<(poVar3,'\t');
    poVar3 = std::operator<<(poVar3,(string *)ppVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4._M_n,in_stack_ffffffffffffffd0._M_n));
  }
  return;
}

Assistant:

void show() { for (auto &item : cumtimes) { std::cout << std::setprecision(4) << std::setw(11) << item.second << '\t' << item.first << std::endl; } }